

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oaa.cc
# Opt level: O0

void predict_or_learn<true,false,true,true>(oaa *o,single_learner *base,example *ec)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  ostream *poVar5;
  float *pfVar6;
  long in_RDX;
  ulong *in_RDI;
  float fVar7;
  double dVar8;
  uint32_t i_5;
  float inv_sum_prob;
  uint32_t i_4;
  float sum_prob;
  uint32_t i_3;
  uint32_t i_2;
  uint32_t i_1;
  uint32_t i;
  v_array<float> scores_array;
  uint32_t prediction;
  stringstream outputStringStream;
  label_t mc_label_data;
  undefined4 in_stack_fffffffffffffda8;
  float in_stack_fffffffffffffdac;
  undefined4 in_stack_fffffffffffffdb0;
  undefined4 in_stack_fffffffffffffdb4;
  example *in_stack_fffffffffffffdb8;
  polyprediction *in_stack_fffffffffffffdc0;
  undefined4 in_stack_fffffffffffffdc8;
  undefined4 in_stack_fffffffffffffdcc;
  size_t in_stack_fffffffffffffdd0;
  undefined4 in_stack_fffffffffffffdd8;
  undefined4 in_stack_fffffffffffffddc;
  undefined4 in_stack_fffffffffffffde0;
  uint uVar9;
  undefined4 in_stack_fffffffffffffde4;
  float fVar10;
  uint local_218;
  float local_214;
  uint local_210;
  uint local_200;
  uint local_1fc;
  uint local_1f8;
  uint local_1ac;
  stringstream local_1a8 [392];
  ulong local_20;
  long local_18;
  ulong *local_8;
  
  local_20 = *(ulong *)(in_RDX + 0x6828);
  local_18 = in_RDX;
  local_8 = in_RDI;
  if (((uint)local_20 == 0) || ((*in_RDI < (local_20 & 0xffffffff) && ((uint)local_20 != -1)))) {
    poVar5 = std::operator<<((ostream *)&std::cout,"label ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,(uint)local_20);
    poVar5 = std::operator<<(poVar5," is not in {1,");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,*local_8);
    poVar5 = std::operator<<(poVar5,"} This won\'t work right.");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  }
  std::__cxx11::stringstream::stringstream(local_1a8);
  local_1ac = 1;
  uVar1 = *(undefined8 *)(local_18 + 0x6850);
  uVar2 = *(undefined8 *)(local_18 + 0x6858);
  uVar3 = *(undefined8 *)(local_18 + 0x6860);
  uVar4 = *(undefined8 *)(local_18 + 0x6868);
  *(undefined4 *)(local_18 + 0x6830) = 0;
  *(undefined8 *)(local_18 + 0x6828) = 0x7f7fffff;
  LEARNER::learner<char,_example>::multipredict
            ((learner<char,_example> *)CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0)
             ,(example *)CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8),
             in_stack_fffffffffffffdd0,CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8)
             ,in_stack_fffffffffffffdc0,SUB81((ulong)in_stack_fffffffffffffdb8 >> 0x38,0));
  for (local_1f8 = 2; (ulong)local_1f8 <= *local_8; local_1f8 = local_1f8 + 1) {
    fVar7 = *(float *)(local_8[2] + (ulong)(local_1f8 - 1) * 0x20);
    pfVar6 = (float *)(local_8[2] + (ulong)(local_1ac - 1) * 0x20);
    if (*pfVar6 <= fVar7 && fVar7 != *pfVar6) {
      local_1ac = local_1f8;
    }
  }
  if (*(long *)(local_18 + 0x68c0) != 0) {
    for (local_1fc = 1; (ulong)local_1fc <= *local_8; local_1fc = local_1fc + 1) {
      add_passthrough_feature_magic
                ((example *)&in_stack_fffffffffffffdc0->scalars,(uint64_t)in_stack_fffffffffffffdb8,
                 CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0),
                 in_stack_fffffffffffffdac);
    }
  }
  for (local_200 = 1; (ulong)local_200 <= *local_8; local_200 = local_200 + 1) {
    uVar9 = *(uint *)(&DAT_003ebf48 + (ulong)((uint)local_20 == local_200) * 4);
    *(undefined4 *)(local_18 + 0x6830) = 0;
    *(ulong *)(local_18 + 0x6828) = (ulong)uVar9;
    *(undefined4 *)(local_18 + 0x6850) = *(undefined4 *)(local_8[2] + (ulong)(local_200 - 1) * 0x20)
    ;
    LEARNER::learner<char,_example>::update
              ((learner<char,_example> *)&in_stack_fffffffffffffdc0->scalars,
               in_stack_fffffffffffffdb8,
               CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0));
  }
  v_array<float>::clear
            ((v_array<float> *)CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0));
  for (local_210 = 0; (ulong)local_210 < *local_8; local_210 = local_210 + 1) {
    v_array<float>::push_back
              ((v_array<float> *)CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0),
               (float *)CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8));
  }
  *(undefined8 *)(local_18 + 0x6850) = uVar1;
  *(undefined8 *)(local_18 + 0x6858) = uVar2;
  *(undefined8 *)(local_18 + 0x6860) = uVar3;
  *(undefined8 *)(local_18 + 0x6868) = uVar4;
  local_214 = 0.0;
  for (local_218 = 0; (ulong)local_218 < *local_8; local_218 = local_218 + 1) {
    dVar8 = std::exp((double)((ulong)*(uint *)(local_8[2] + (ulong)local_218 * 0x20) ^
                             0x8000000080000000));
    fVar7 = 1.0 / (SUB84(dVar8,0) + 1.0);
    pfVar6 = v_array<float>::operator[]((v_array<float> *)(local_18 + 0x6850),(ulong)local_218);
    *pfVar6 = fVar7;
    pfVar6 = v_array<float>::operator[]((v_array<float> *)(local_18 + 0x6850),(ulong)local_218);
    local_214 = *pfVar6 + local_214;
  }
  fVar7 = 1.0 / local_214;
  for (uVar9 = 0; (ulong)uVar9 < *local_8; uVar9 = uVar9 + 1) {
    fVar10 = fVar7;
    pfVar6 = v_array<float>::operator[]((v_array<float> *)(local_18 + 0x6850),(ulong)uVar9);
    *pfVar6 = fVar7 * *pfVar6;
    fVar7 = fVar10;
  }
  *(ulong *)(local_18 + 0x6828) = local_20;
  std::__cxx11::stringstream::~stringstream(local_1a8);
  return;
}

Assistant:

void predict_or_learn(oaa& o, LEARNER::single_learner& base, example& ec)
{
  MULTICLASS::label_t mc_label_data = ec.l.multi;
  if (mc_label_data.label == 0 || (mc_label_data.label > o.k && mc_label_data.label != (uint32_t)-1))
    cout << "label " << mc_label_data.label << " is not in {1," << o.k << "} This won't work right." << endl;

  stringstream outputStringStream;
  uint32_t prediction = 1;
  v_array<float> scores_array;
  if (scores)
    scores_array = ec.pred.scalars;

  ec.l.simple = {FLT_MAX, 0.f, 0.f};
  base.multipredict(ec, 0, o.k, o.pred, true);
  for (uint32_t i = 2; i <= o.k; i++)
    if (o.pred[i - 1].scalar > o.pred[prediction - 1].scalar)
      prediction = i;

  if (ec.passthrough)
    for (uint32_t i = 1; i <= o.k; i++) add_passthrough_feature(ec, i, o.pred[i - 1].scalar);

  if (is_learn)
  {
    for (uint32_t i = 1; i <= o.k; i++)
    {
      ec.l.simple = {(mc_label_data.label == i) ? 1.f : -1.f, 0.f, 0.f};
      ec.pred.scalar = o.pred[i - 1].scalar;
      base.update(ec, i - 1);
    }
  }

  if (print_all)
  {
    outputStringStream << "1:" << o.pred[0].scalar;
    for (uint32_t i = 2; i <= o.k; i++) outputStringStream << ' ' << i << ':' << o.pred[i - 1].scalar;
    o.all->print_text(o.all->raw_prediction, outputStringStream.str(), ec.tag);
  }

  if (scores)
  {
    scores_array.clear();
    for (uint32_t i = 0; i < o.k; i++) scores_array.push_back(o.pred[i].scalar);
    ec.pred.scalars = scores_array;

    if (probabilities)
    {
      float sum_prob = 0;
      for (uint32_t i = 0; i < o.k; i++)
      {
        ec.pred.scalars[i] = 1.f / (1.f + correctedExp(-o.pred[i].scalar));
        sum_prob += ec.pred.scalars[i];
      }
      float inv_sum_prob = 1.f / sum_prob;
      for (uint32_t i = 0; i < o.k; i++) ec.pred.scalars[i] *= inv_sum_prob;
    }
  }
  else
    ec.pred.multiclass = prediction;

  ec.l.multi = mc_label_data;
}